

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data_const&>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,Data *args)

{
  Data **ppDVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  int iVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  undefined4 uVar12;
  int iVar13;
  qint64 qVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00405ae8:
    pDVar8 = (args->abbreviation).d.d;
    pcVar9 = (args->abbreviation).d.ptr;
    qVar10 = (args->abbreviation).d.size;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    iVar4 = args->daylightTimeOffset;
    qVar14 = args->atMSecsSinceEpoch;
    uVar15 = args->offsetFromUtc;
    uVar16 = args->standardTimeOffset;
    bVar17 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
    QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
              ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar17),1,
               (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
    pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
              super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    local_58 = (undefined4)qVar14;
    uStack_54 = (undefined4)((ulong)qVar14 >> 0x20);
    if (i != 0 || !bVar17) {
      pDVar3 = pDVar11 + i;
      memmove(pDVar3 + 1,pDVar11 + i,
              ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.size - i) * 0x30);
      (pDVar3->abbreviation).d.d = pDVar8;
      (pDVar3->abbreviation).d.ptr = pcVar9;
      (pDVar3->abbreviation).d.size = qVar10;
      *(undefined4 *)&pDVar3->atMSecsSinceEpoch = local_58;
      *(undefined4 *)((long)&pDVar3->atMSecsSinceEpoch + 4) = uStack_54;
      pDVar3->offsetFromUtc = uVar15;
      pDVar3->standardTimeOffset = uVar16;
      pDVar3->daylightTimeOffset = iVar4;
      goto LAB_00405bbe;
    }
    pDVar11[-1].abbreviation.d.d = pDVar8;
    pDVar11[-1].abbreviation.d.ptr = pcVar9;
    pDVar11[-1].abbreviation.d.size = qVar10;
    *(undefined4 *)&pDVar11[-1].atMSecsSinceEpoch = local_58;
    *(undefined4 *)((long)&pDVar11[-1].atMSecsSinceEpoch + 4) = uStack_54;
    pDVar11[-1].offsetFromUtc = uVar15;
    pDVar11[-1].standardTimeOffset = uVar16;
    pDVar11[-1].daylightTimeOffset = iVar4;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
    if ((lVar7 == i && pDVar6 != (Data *)0x0) &&
       ((pDVar6->super_QArrayData).alloc - lVar7 !=
        ((long)((long)(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                      super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
      pDVar8 = (args->abbreviation).d.d;
      pDVar11[lVar7].abbreviation.d.d = pDVar8;
      pDVar11[lVar7].abbreviation.d.ptr = (args->abbreviation).d.ptr;
      pDVar11[lVar7].abbreviation.d.size = (args->abbreviation).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar11[lVar7].daylightTimeOffset = args->daylightTimeOffset;
      uVar12 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
      iVar4 = args->offsetFromUtc;
      iVar13 = args->standardTimeOffset;
      *(int *)&pDVar11[lVar7].atMSecsSinceEpoch = (int)args->atMSecsSinceEpoch;
      *(undefined4 *)((long)&pDVar11[lVar7].atMSecsSinceEpoch + 4) = uVar12;
      pDVar11[lVar7].offsetFromUtc = iVar4;
      pDVar11[lVar7].standardTimeOffset = iVar13;
      goto LAB_00405bbe;
    }
    if (((i != 0) || (pDVar6 == (Data *)0x0)) ||
       ((Data *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
        super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr)) goto LAB_00405ae8;
    pDVar11 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
              super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    pDVar8 = (args->abbreviation).d.d;
    pDVar11[-1].abbreviation.d.d = pDVar8;
    pDVar11[-1].abbreviation.d.ptr = (args->abbreviation).d.ptr;
    pDVar11[-1].abbreviation.d.size = (args->abbreviation).d.size;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    pDVar11[-1].daylightTimeOffset = args->daylightTimeOffset;
    uVar12 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
    iVar4 = args->offsetFromUtc;
    iVar13 = args->standardTimeOffset;
    *(int *)&pDVar11[-1].atMSecsSinceEpoch = (int)args->atMSecsSinceEpoch;
    *(undefined4 *)((long)&pDVar11[-1].atMSecsSinceEpoch + 4) = uVar12;
    pDVar11[-1].offsetFromUtc = iVar4;
    pDVar11[-1].standardTimeOffset = iVar13;
  }
  ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
  *ppDVar1 = *ppDVar1 + -1;
LAB_00405bbe:
  pqVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }